

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tearing.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar2;
  GLFWwindow *handle_00;
  int height;
  long lVar3;
  bool bVar4;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double local_28;
  
  bVar4 = true;
  while( true ) {
    while( true ) {
      iVar1 = getopt(argc,argv,"fh");
      if (iVar1 != 0x66) break;
      bVar4 = false;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x68) {
      usage();
LAB_00104e99:
      exit(0);
    }
  }
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
LAB_00104cf9:
    exit(1);
  }
  if (bVar4) {
    iVar1 = 0x280;
    height = 0x1e0;
    handle = (GLFWmonitor *)0x0;
  }
  else {
    handle = glfwGetPrimaryMonitor();
    pGVar2 = glfwGetVideoMode(handle);
    glfwWindowHint(0x21001,pGVar2->redBits);
    glfwWindowHint(0x21002,pGVar2->greenBits);
    glfwWindowHint(0x21003,pGVar2->blueBits);
    glfwWindowHint(0x2100f,pGVar2->refreshRate);
    iVar1 = pGVar2->width;
    height = pGVar2->height;
  }
  handle_00 = glfwCreateWindow(iVar1,height,"",handle,(GLFWwindow *)0x0);
  if (handle_00 == (GLFWwindow *)0x0) {
    glfwTerminate();
    goto LAB_00104cf9;
  }
  glfwMakeContextCurrent(handle_00);
  swap_interval = 0;
  glfwSwapInterval(0);
  update_window_title(handle_00);
  local_28 = glfwGetTime();
  frame_rate = 0.0;
  iVar1 = glfwExtensionSupported("WGL_EXT_swap_control_tear");
  bVar4 = true;
  if (iVar1 == 0) {
    iVar1 = glfwExtensionSupported("GLX_EXT_swap_control_tear");
    bVar4 = iVar1 != 0;
  }
  swap_tear = bVar4;
  glfwSetFramebufferSizeCallback(handle_00,framebuffer_size_callback);
  glfwSetKeyCallback(handle_00,key_callback);
  glMatrixMode(0x1701);
  glOrtho(0xbff0000000000000,0x3ff0000000000000,0xbff0000000000000,0x3ff0000000000000,
          0x3ff0000000000000,0);
  glMatrixMode(0x1700);
  iVar1 = glfwWindowShouldClose(handle_00);
  if (iVar1 == 0) {
    lVar3 = 0;
    do {
      glClear(0x4000);
      dVar6 = glfwGetTime();
      fVar5 = cosf((float)dVar6 * 4.0);
      glRectf(fVar5 * 0.75 + -0.25);
      glfwSwapBuffers(handle_00);
      glfwPollEvents();
      lVar3 = lVar3 + 1;
      dVar6 = glfwGetTime();
      if (1.0 < dVar6 - local_28) {
        auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar7._0_8_ = lVar3;
        auVar7._12_4_ = 0x45300000;
        frame_rate = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
                     (dVar6 - local_28);
        update_window_title(handle_00);
        lVar3 = 0;
        local_28 = dVar6;
      }
      iVar1 = glfwWindowShouldClose(handle_00);
    } while (iVar1 == 0);
  }
  glfwTerminate();
  goto LAB_00104e99;
}

Assistant:

int main(int argc, char** argv)
{
    int ch, width, height;
    float position;
    unsigned long frame_count = 0;
    double last_time, current_time;
    GLboolean fullscreen = GL_FALSE;
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GL_TRUE;
                break;
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (fullscreen)
    {
        const GLFWvidmode* mode;

        monitor = glfwGetPrimaryMonitor();
        mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);
        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width = 640;
        height = 480;
    }

    window = glfwCreateWindow(width, height, "", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    set_swap_interval(window, 0);

    last_time = glfwGetTime();
    frame_rate = 0.0;
    swap_tear = (glfwExtensionSupported("WGL_EXT_swap_control_tear") ||
                 glfwExtensionSupported("GLX_EXT_swap_control_tear"));

    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetKeyCallback(window, key_callback);

    glMatrixMode(GL_PROJECTION);
    glOrtho(-1.f, 1.f, -1.f, 1.f, 1.f, -1.f);
    glMatrixMode(GL_MODELVIEW);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        position = cosf((float) glfwGetTime() * 4.f) * 0.75f;
        glRectf(position - 0.25f, -1.f, position + 0.25f, 1.f);

        glfwSwapBuffers(window);
        glfwPollEvents();

        frame_count++;

        current_time = glfwGetTime();
        if (current_time - last_time > 1.0)
        {
            frame_rate = frame_count / (current_time - last_time);
            frame_count = 0;
            last_time = current_time;
            update_window_title(window);
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}